

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash_test.cpp
# Opt level: O0

pint p_test_case_sha2_256_test(void)

{
  pint pVar1;
  puchar local_78 [8];
  puchar hash_etalon_3 [32];
  puchar hash_etalon_2 [32];
  puchar hash_etalon_1 [32];
  
  p_test_module_fail_counter = 0;
  hash_etalon_2[0x18] = 0xba;
  hash_etalon_2[0x19] = 'x';
  hash_etalon_2[0x1a] = '\x16';
  hash_etalon_2[0x1b] = 0xbf;
  hash_etalon_2[0x1c] = 0x8f;
  hash_etalon_2[0x1d] = '\x01';
  hash_etalon_2[0x1e] = 0xcf;
  hash_etalon_2[0x1f] = 0xea;
  hash_etalon_3[0x18] = '$';
  hash_etalon_3[0x19] = 0x8d;
  hash_etalon_3[0x1a] = 'j';
  hash_etalon_3[0x1b] = 'a';
  hash_etalon_3[0x1c] = 0xd2;
  hash_etalon_3[0x1d] = '\x06';
  hash_etalon_3[0x1e] = '8';
  hash_etalon_3[0x1f] = 0xb8;
  hash_etalon_2[0] = 0xe5;
  hash_etalon_2[1] = 0xc0;
  hash_etalon_2[2] = '&';
  hash_etalon_2[3] = 0x93;
  hash_etalon_2[4] = '\f';
  hash_etalon_2[5] = '>';
  hash_etalon_2[6] = '`';
  hash_etalon_2[7] = '9';
  hash_etalon_2[8] = 0xa3;
  hash_etalon_2[9] = '<';
  hash_etalon_2[10] = 0xe4;
  hash_etalon_2[0xb] = 'Y';
  hash_etalon_2[0xc] = 'd';
  hash_etalon_2[0xd] = 0xff;
  hash_etalon_2[0xe] = '!';
  hash_etalon_2[0xf] = 'g';
  hash_etalon_2[0x10] = 0xf6;
  hash_etalon_2[0x11] = 0xec;
  hash_etalon_2[0x12] = 0xed;
  hash_etalon_2[0x13] = 0xd4;
  hash_etalon_2[0x14] = '\x19';
  hash_etalon_2[0x15] = 0xdb;
  hash_etalon_2[0x16] = '\x06';
  hash_etalon_2[0x17] = 0xc1;
  local_78[0] = 0xcd;
  local_78[1] = 199;
  local_78[2] = 'n';
  local_78[3] = '\\';
  local_78[4] = 0x99;
  local_78[5] = '\x14';
  local_78[6] = 0xfb;
  local_78[7] = 0x92;
  hash_etalon_3[0] = 0x81;
  hash_etalon_3[1] = 0xa1;
  hash_etalon_3[2] = 199;
  hash_etalon_3[3] = 0xe2;
  hash_etalon_3[4] = 0x84;
  hash_etalon_3[5] = 0xd7;
  hash_etalon_3[6] = '>';
  hash_etalon_3[7] = 'g';
  hash_etalon_3[8] = 0xf1;
  hash_etalon_3[9] = 0x80;
  hash_etalon_3[10] = 0x9a;
  hash_etalon_3[0xb] = 'H';
  hash_etalon_3[0xc] = 0xa4;
  hash_etalon_3[0xd] = 0x97;
  hash_etalon_3[0xe] = ' ';
  hash_etalon_3[0xf] = '\x0e';
  hash_etalon_3[0x10] = '\x04';
  hash_etalon_3[0x11] = 'm';
  hash_etalon_3[0x12] = '9';
  hash_etalon_3[0x13] = 0xcc;
  hash_etalon_3[0x14] = 199;
  hash_etalon_3[0x15] = '\x11';
  hash_etalon_3[0x16] = ',';
  hash_etalon_3[0x17] = 0xd0;
  p_libsys_init();
  general_hash_test(P_CRYPTO_HASH_TYPE_SHA2_256,0x20,"abc",
                    "abcdbcdecdefdefgefghfghighijhijkijkljklmklmnlmnomnopnopq",hash_etalon_2 + 0x18,
                    hash_etalon_3 + 0x18,local_78,
                    "ba7816bf8f01cfea414140de5dae2223b00361a396177a9cb410ff61f20015ad",
                    "248d6a61d20638b8e5c026930c3e6039a33ce45964ff2167f6ecedd419db06c1",
                    "cdc76e5c9914fb9281a1c7e284d73e67f1809a48a497200e046d39ccc7112cd0",
                    "4c2d7749e1b711ca652fda20dd29fe378fd9988f19eadadfa570682e2c55349f");
  p_libsys_shutdown();
  pVar1 = -1;
  if (p_test_module_fail_counter == 0) {
    pVar1 = 0;
  }
  return pVar1;
}

Assistant:

P_TEST_CASE_BEGIN (sha2_256_test)
{
	const puchar	hash_etalon_1[] = {186, 120,  22, 191, 143,   1, 207, 234,
					    65,  65,  64, 222,  93, 174,  34,  35,
					   176,   3,  97, 163, 150,  23, 122, 156,
					   180,  16, 255,  97, 242,   0,  21, 173};
	const puchar	hash_etalon_2[] = { 36, 141, 106,  97, 210,   6,  56, 184,
					   229, 192,  38, 147,  12,  62,  96,  57,
					   163,  60, 228,  89, 100, 255,  33, 103,
					   246, 236, 237, 212,  25, 219,   6, 193};
	const puchar	hash_etalon_3[] = {205, 199, 110,  92, 153,  20, 251, 146,
					   129, 161, 199, 226, 132, 215,  62, 103,
					   241, 128, 154,  72, 164, 151,  32,  14,
					     4, 109,  57, 204, 199,  17,  44, 208};

	p_libsys_init ();

	general_hash_test (P_CRYPTO_HASH_TYPE_SHA2_256,
			   32,
			   "abc",
			   "abcdbcdecdefdefgefghfghighijhijkijkljklmklmnlmnomnopnopq",
			   hash_etalon_1,
			   hash_etalon_2,
			   hash_etalon_3,
			   "ba7816bf8f01cfea414140de5dae2223b00361a396177a9cb410ff61f20015ad",
			   "248d6a61d20638b8e5c026930c3e6039a33ce45964ff2167f6ecedd419db06c1",
			   "cdc76e5c9914fb9281a1c7e284d73e67f1809a48a497200e046d39ccc7112cd0",
			   "4c2d7749e1b711ca652fda20dd29fe378fd9988f19eadadfa570682e2c55349f");

	p_libsys_shutdown ();
}